

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trampoline.cpp
# Opt level: O3

Object * scm::trampoline::trampoline(Continuation *startFunction)

{
  Verbosity VVar1;
  Object *obj;
  double __x;
  double __x_00;
  double __x_01;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string local_40;
  
  VVar1 = loguru::current_verbosity_cutoff();
  if ((-1 < VVar1) && (LOG_TRAMPOLINE_TRACE != '\0')) {
    loguru::log(__x);
  }
  pushFunc((Continuation *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (startFunction != (Continuation *)0x0) {
    do {
      VVar1 = loguru::current_verbosity_cutoff();
      if ((-1 < VVar1) && (LOG_TRAMPOLINE_TRACE != '\0')) {
        loguru::log(__x_00);
      }
      startFunction = (Continuation *)(*startFunction)();
    } while (startFunction != (Continuation *)0x0);
  }
  VVar1 = loguru::current_verbosity_cutoff();
  if ((-1 < VVar1) && ((LOG_TRAMPOLINE_TRACE != '\0' || (LOG_STACK_TRACE != '\0')))) {
    toString_abi_cxx11_(&local_40,(scm *)lastReturnValue,obj);
    loguru::log(__x_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return lastReturnValue;
}

Assistant:

Object* trampoline(Continuation* startFunction)
{
  DLOG_IF_F(INFO, LOG_TRAMPOLINE_TRACE, "in: trampoline");
  Continuation* nextFunction{startFunction};
  pushFunc(NULL);
  while (nextFunction != NULL) {
    DLOG_IF_F(INFO, LOG_TRAMPOLINE_TRACE, "in: trampoline loop");
    nextFunction = (Continuation*)(*nextFunction)();
  }
  DLOG_IF_F(INFO,
            LOG_TRAMPOLINE_TRACE || LOG_STACK_TRACE,
            "trampoline finished | returning %s | argStack: %d | funcStack: %d",
            toString(lastReturnValue).c_str(),
            static_cast<int>(argumentStack.size()),
            static_cast<int>(functionStack.size()));
  return lastReturnValue;
}